

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<tcu::Vector<int,_3>_>::iterate
          (ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this)

{
  GetConstantValueFunc p_Var1;
  ScopedLogSection SVar2;
  ShaderType shaderType_00;
  RenderContext *pRVar3;
  TestLog *log;
  NotSupportedError *e;
  TestError *e_1;
  undefined1 local_8a;
  allocator<char> local_89;
  undefined1 local_88 [6];
  bool isOk;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  char *shaderTypeName;
  int shaderType;
  Vector<int,_3> reference;
  ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this_local;
  
  p_Var1 = this->m_getValue;
  reference.m_data._4_8_ = this;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  (*pRVar3->_vptr_RenderContext[3])();
  (*p_Var1)((Functions *)((long)&shaderTypeName + 4));
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  for (shaderTypeName._0_4_ = SHADERTYPE_VERTEX; (int)(ShaderType)shaderTypeName < 6;
      shaderTypeName._0_4_ = (ShaderType)shaderTypeName + SHADERTYPE_FRAGMENT) {
    if ((1 << ((byte)(ShaderType)shaderTypeName & 0x1f) & 0x3fU) != 0) {
      section.m_log = (TestLog *)glu::getShaderTypeName((ShaderType)shaderTypeName);
      log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
      ;
      SVar2.m_log = section.m_log;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)SVar2.m_log,&local_51);
      SVar2 = section;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,(char *)SVar2.m_log,&local_89);
      tcu::ScopedLogSection::ScopedLogSection(&local_30,log,&local_50,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
      std::allocator<char>::~allocator(&local_89);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      shaderType_00 = (ShaderType)shaderTypeName;
      tcu::Vector<int,_3>::Vector
                ((Vector<int,_3> *)&e_1,(Vector<int,_3> *)((long)&shaderTypeName + 4));
      local_8a = verifyInShaderType(this,shaderType_00,(Vector<int,_3> *)&e_1);
      tcu::ScopedLogSection::~ScopedLogSection(&local_30);
    }
  }
  return STOP;
}

Assistant:

TestCase::IterateResult ShaderBuiltinConstantCase<DataType>::iterate (void)
{
	const DataType	reference	= m_getValue(m_context.getRenderContext().getFunctions());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
	{
		if ((SHADER_TYPES & (1<<shaderType)) != 0)
		{
			const char* const			shaderTypeName	= glu::getShaderTypeName(glu::ShaderType(shaderType));
			const tcu::ScopedLogSection	section			(m_testCtx.getLog(), shaderTypeName, shaderTypeName);

			try
			{
				const bool isOk = verifyInShaderType(glu::ShaderType(shaderType), reference);
				DE_ASSERT(isOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);
				DE_UNREF(isOk);
			}
			catch (const tcu::NotSupportedError& e)
			{
				m_testCtx.getLog() << TestLog::Message << "Not checking " << shaderTypeName << ": " << e.what() << TestLog::EndMessage;
			}
			catch (const tcu::TestError& e)
			{
				m_testCtx.getLog() << TestLog::Message << e.what() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
			}
		}
	}

	return STOP;
}